

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

void __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::erasenonleaf(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
               *this,int *cur,node **p,int *pp,locType *pos)

{
  uint uVar1;
  int iVar2;
  node *pnVar3;
  DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *pDVar4;
  _func_int *p_Var5;
  pair<unsigned_long_long,_int> *this_00;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  long lVar8;
  long lVar9;
  pair<unsigned_long_long,_int> *ppVar10;
  node **ppnVar11;
  int aiStackY_c0 [2];
  undefined1 auStackY_b8 [16];
  pair<unsigned_long_long,_int> *local_a8;
  pair<unsigned_long_long,_int> *local_a0;
  locType in_stack_ffffffffffffff68;
  undefined1 *puVar12;
  DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *in_stack_ffffffffffffff70;
  pair<unsigned_long_long,_int> old;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_4c;
  int newsz;
  node **y;
  int j;
  int i;
  node **x;
  locType *pos_local;
  int *pp_local;
  node **p_local;
  int *cur_local;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *this_local;
  
  _j = p + *cur;
  y._0_4_ = pp[*cur];
  x = (node **)pos;
  pos_local = (locType *)pp;
  pp_local = (int *)p;
  p_local = (node **)cur;
  cur_local = &this->depth;
  iVar6 = (int)y;
  while (y._4_4_ = iVar6 + 1, y._4_4_ < (*_j)->sz) {
    aiStackY_c0[0] = 0x11e114;
    aiStackY_c0[1] = 0;
    std::pair<unsigned_long_long,_int>::operator=((*_j)->keyvalue + iVar6,(*_j)->keyvalue + y._4_4_)
    ;
    ((*_j)->field_0).val[y._4_4_] = ((*_j)->field_0).val[y._4_4_ + 1];
    iVar6 = y._4_4_;
  }
  (*_j)->sz = (*_j)->sz + -1;
  if (*(int *)p_local == 0) {
    if ((*_j)->sz == 0) {
      this->depth = this->depth + -1;
      aiStackY_c0[0] = 0x11e189;
      aiStackY_c0[1] = 0;
      DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
      ::release(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      this->root = (locType)x[1];
    }
    else {
      aiStackY_c0[0] = 0x11e1ad;
      aiStackY_c0[1] = 0;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        )._vptr_FileManager_Base[3])(this->file,x);
    }
  }
  else if ((*_j)->sz < 0x31) {
    if (*(int *)((long)pos_local + (long)(*(int *)p_local + -1) * 4) ==
        *(int *)(*(long *)(pp_local + (long)(*(int *)p_local + -1) * 2) + 0x958)) {
      *(undefined8 *)(pp_local + (long)(*(int *)p_local + 1) * 2) =
           *(undefined8 *)(pp_local + (long)*(int *)p_local * 2);
      *(undefined4 *)((long)pos_local + (long)(*(int *)p_local + 1) * 4) =
           *(undefined4 *)((long)pos_local + (long)(*(int *)p_local + -1) * 4);
      x[*(int *)p_local + 1] = x[*(int *)p_local];
      *(int *)((long)pos_local + (long)(*(int *)p_local + -1) * 4) =
           *(int *)(*(long *)(pp_local + (long)(*(int *)p_local + -1) * 2) + 0x958) + -1;
      x[*(int *)p_local] =
           *(node **)(*(long *)(pp_local + (long)(*(int *)p_local + -1) * 2) +
                     (long)*(int *)((long)pos_local + (long)(*(int *)p_local + -1) * 4) * 8);
      aiStackY_c0[0] = 0x11e311;
      aiStackY_c0[1] = 0;
      iVar6 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[2])(this->file,x + *(int *)p_local);
      *(ulong *)(pp_local + (long)*(int *)p_local * 2) = CONCAT44(extraout_var,iVar6);
    }
    else {
      *(int *)((long)pos_local + (long)(*(int *)p_local + 1) * 4) =
           *(int *)((long)pos_local + (long)(*(int *)p_local + -1) * 4) + 1;
      x[*(int *)p_local + 1] =
           *(node **)(*(long *)(pp_local + (long)(*(int *)p_local + -1) * 2) +
                     (long)*(int *)((long)pos_local + (long)(*(int *)p_local + 1) * 4) * 8);
      aiStackY_c0[0] = 0x11e3b5;
      aiStackY_c0[1] = 0;
      iVar6 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[2])(this->file,x + (*(int *)p_local + 1));
      *(ulong *)(pp_local + (long)(*(int *)p_local + 1) * 2) = CONCAT44(extraout_var_00,iVar6);
    }
    _newsz = (long *)(pp_local + (long)(*(int *)p_local + 1) * 2);
    if ((*_j)->sz + *(int *)(*_newsz + 0x958) < 99) {
      aiStackY_c0[0] = 0x11e468;
      aiStackY_c0[1] = 0;
      std::pair<unsigned_long_long,_int>::operator=
                ((*_j)->keyvalue + (*_j)->sz,
                 (type)(*(long *)(pp_local + (long)(*(int *)p_local + -1) * 2) + 0x328 +
                       (long)*(int *)((long)pos_local + (long)(*(int *)p_local + -1) * 4) * 0x10));
      for (y._4_4_ = 0; y._4_4_ < *(int *)(*_newsz + 0x958); y._4_4_ = y._4_4_ + 1) {
        ((*_j)->field_0).val[(*_j)->sz + 1 + y._4_4_] = *(long *)(*_newsz + (long)y._4_4_ * 8);
        aiStackY_c0[0] = 0x11e4fd;
        aiStackY_c0[1] = 0;
        std::pair<unsigned_long_long,_int>::operator=
                  ((*_j)->keyvalue + ((*_j)->sz + 1 + y._4_4_),
                   (type)(*_newsz + 0x328 + (long)y._4_4_ * 0x10));
      }
      lVar8 = *(long *)(*_newsz + (long)*(int *)(*_newsz + 0x958) * 8);
      pnVar3 = *_j;
      iVar6 = *(int *)(*_newsz + 0x958) + 1 + (*_j)->sz;
      (*_j)->sz = iVar6;
      (pnVar3->field_0).val[iVar6] = lVar8;
      aiStackY_c0[0] = 0x11e575;
      aiStackY_c0[1] = 0;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        )._vptr_FileManager_Base[3])(this->file,x + *(int *)p_local);
      aiStackY_c0[0] = 0x11e596;
      aiStackY_c0[1] = 0;
      DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
      ::release(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_4c = *(int *)p_local + -1;
      aiStackY_c0[0] = 0x11e5bb;
      aiStackY_c0[1] = 0;
      erasenonleaf(this,&local_4c,(node **)pp_local,(int *)pos_local,(locType *)x);
    }
    else {
      uVar1 = (*_j)->sz + 1 + *(int *)(*_newsz + 0x958);
      puVar12 = auStackY_b8 + -((ulong)(uVar1 + 1) * 8 + 0xf & 0xfffffffffffffff0);
      uVar7 = (ulong)uVar1;
      ppVar10 = (pair<unsigned_long_long,_int> *)(puVar12 + uVar7 * -0x10);
      if (uVar7 != 0) {
        local_a8 = ppVar10 + uVar7;
        local_a0 = ppVar10;
        do {
          this_00 = local_a0;
          auStackY_b8._8_8_ = local_a0;
          *(undefined8 *)&ppVar10[-1].second = 0x11e66f;
          std::pair<unsigned_long_long,_int>::pair<unsigned_long_long,_int,_true>(this_00);
          local_a0 = (pair<unsigned_long_long,_int> *)(auStackY_b8._8_8_ + 0x10);
        } while (local_a0 != local_a8);
      }
      for (y._4_4_ = 0; y._4_4_ < (*_j)->sz; y._4_4_ = y._4_4_ + 1) {
        *(long *)(puVar12 + (long)y._4_4_ * 8) = ((*_j)->field_0).val[y._4_4_];
        pnVar3 = *_j;
        lVar8 = (long)y._4_4_;
        lVar9 = (long)y._4_4_;
        *(undefined8 *)&ppVar10[-1].second = 0x11e70e;
        std::pair<unsigned_long_long,_int>::operator=(ppVar10 + lVar9,pnVar3->keyvalue + lVar8);
      }
      *(long *)(puVar12 + (long)(*_j)->sz * 8) = ((*_j)->field_0).val[(*_j)->sz];
      lVar8 = *(long *)(pp_local + (long)(*(int *)p_local + -1) * 2);
      iVar6 = *(int *)((long)pos_local + (long)(*(int *)p_local + -1) * 4);
      iVar2 = (*_j)->sz;
      *(undefined8 *)&ppVar10[-1].second = 0x11e79f;
      std::pair<unsigned_long_long,_int>::operator=
                (ppVar10 + iVar2,(type)(lVar8 + 0x328 + (long)iVar6 * 0x10));
      y._4_4_ = (*_j)->sz;
      while (y._4_4_ = y._4_4_ + 1, y._4_4_ < (int)uVar1) {
        *(undefined8 *)(puVar12 + (long)y._4_4_ * 8) =
             *(undefined8 *)(*_newsz + (long)((y._4_4_ - (*_j)->sz) + -1) * 8);
        lVar8 = *_newsz;
        iVar6 = y._4_4_ - (*_j)->sz;
        lVar9 = (long)y._4_4_;
        *(undefined8 *)&ppVar10[-1].second = 0x11e828;
        std::pair<unsigned_long_long,_int>::operator=
                  (ppVar10 + lVar9,(type)(lVar8 + 0x328 + (long)(iVar6 + -1) * 0x10));
      }
      *(undefined8 *)(puVar12 + (long)(int)uVar1 * 8) =
           *(undefined8 *)(*_newsz + (long)*(int *)(*_newsz + 0x958) * 8);
      (*_j)->sz = (int)uVar1 >> 1;
      *(uint *)(*_newsz + 0x958) = (uVar1 - (*_j)->sz) + -1;
      for (y._4_4_ = 0; y._4_4_ < (*_j)->sz; y._4_4_ = y._4_4_ + 1) {
        ((*_j)->field_0).val[y._4_4_] = *(long *)(puVar12 + (long)y._4_4_ * 8);
        lVar8 = (long)y._4_4_;
        pnVar3 = *_j;
        lVar9 = (long)y._4_4_;
        *(undefined8 *)&ppVar10[-1].second = 0x11e8f4;
        std::pair<unsigned_long_long,_int>::operator=(pnVar3->keyvalue + lVar9,ppVar10 + lVar8);
      }
      ((*_j)->field_0).val[(*_j)->sz] = *(long *)(puVar12 + (long)(*_j)->sz * 8);
      iVar6 = (*_j)->sz;
      lVar8 = *(long *)(pp_local + (long)(*(int *)p_local + -1) * 2);
      iVar2 = *(int *)((long)pos_local + (long)(*(int *)p_local + -1) * 4);
      *(undefined8 *)&ppVar10[-1].second = 0x11e985;
      std::pair<unsigned_long_long,_int>::operator=
                ((pair<unsigned_long_long,_int> *)(lVar8 + 0x328 + (long)iVar2 * 0x10),
                 ppVar10 + iVar6);
      for (y._4_4_ = 0; y._4_4_ < *(int *)(*_newsz + 0x958); y._4_4_ = y._4_4_ + 1) {
        *(undefined8 *)(*_newsz + (long)y._4_4_ * 8) =
             *(undefined8 *)(puVar12 + (long)(y._4_4_ + (*_j)->sz + 1) * 8);
        iVar6 = y._4_4_ + (*_j)->sz;
        lVar8 = *_newsz;
        lVar9 = (long)y._4_4_;
        *(undefined8 *)&ppVar10[-1].second = 0x11ea0c;
        std::pair<unsigned_long_long,_int>::operator=
                  ((pair<unsigned_long_long,_int> *)(lVar8 + 0x328 + lVar9 * 0x10),
                   ppVar10 + (iVar6 + 1));
      }
      *(undefined8 *)(*_newsz + (long)*(int *)(*_newsz + 0x958) * 8) =
           *(undefined8 *)(puVar12 + (long)(int)uVar1 * 8);
      pDVar4 = this->file;
      ppnVar11 = x + *(int *)p_local;
      p_Var5 = (pDVar4->
               super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
               )._vptr_FileManager_Base[3];
      *(undefined8 *)&ppVar10[-1].second = 0x11ea62;
      (*p_Var5)(pDVar4,ppnVar11);
      pDVar4 = this->file;
      ppnVar11 = x + (*(int *)p_local + 1);
      p_Var5 = (pDVar4->
               super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
               )._vptr_FileManager_Base[3];
      *(undefined8 *)&ppVar10[-1].second = 0x11ea86;
      (*p_Var5)(pDVar4,ppnVar11);
      pDVar4 = this->file;
      ppnVar11 = x + (*(int *)p_local + -1);
      p_Var5 = (pDVar4->
               super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
               )._vptr_FileManager_Base[3];
      *(undefined8 *)&ppVar10[-1].second = 0x11eaaa;
      (*p_Var5)(pDVar4,ppnVar11);
    }
  }
  else {
    aiStackY_c0[0] = 0x11e1e2;
    aiStackY_c0[1] = 0;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
      )._vptr_FileManager_Base[3])(this->file,x + *(int *)p_local);
  }
  return;
}

Assistant:

void erasenonleaf(const int &cur, node **p, int *pp, locType *pos) {
            node *&x = p[cur];
            int i, j = pp[cur];
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->pointer[i] = x->pointer[i + 1];
            --x->sz;
            if (!cur) {
                if (!x->sz) {
                    --depth;
                    file->release(root);
                    root = pos[1];
                } else {
                    file->save(pos[0]);
                }
                return;
            }
            if (x->sz >= degree - 1 >> 1) {
                file->save(pos[cur]);
                return;
            }
            if (pp[cur - 1] == p[cur - 1]->sz) {
                p[cur + 1] = p[cur];
                pp[cur + 1] = pp[cur - 1];
                pos[cur + 1] = pos[cur];
                pp[cur - 1] = p[cur - 1]->sz - 1;
                pos[cur] = p[cur - 1]->pointer[pp[cur - 1]];
                p[cur] = file->read(pos[cur]);
            } else {
                pp[cur + 1] = pp[cur - 1] + 1;
                pos[cur + 1] = p[cur - 1]->pointer[pp[cur + 1]];
                p[cur + 1] = file->read(pos[cur + 1]);
            }
            node *&y = p[cur + 1];
            if (x->sz + y->sz < degree - 1) {
                x->keyvalue[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = 0; i < y->sz; ++i)
                    x->pointer[x->sz + 1 + i] = y->pointer[i], x->keyvalue[x->sz + 1 + i] = y->keyvalue[i];
                x->pointer[x->sz += 1 + y->sz] = y->pointer[y->sz];
                file->save(pos[cur]);
                file->release(pos[cur + 1]);
                erasenonleaf(cur - 1, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz + 1;
                locType tmpp[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpp[i] = x->pointer[i], tmpk[i] = x->keyvalue[i];
                tmpp[x->sz] = x->pointer[x->sz];
                tmpk[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = x->sz + 1; i < newsz; ++i)
                    tmpp[i] = y->pointer[i - x->sz - 1], tmpk[i] = y->keyvalue[i - x->sz - 1];
                tmpp[newsz] = y->pointer[y->sz];
                x->sz = newsz >> 1;
                y->sz = newsz - x->sz - 1;
                for (i = 0; i < x->sz; ++i)x->pointer[i] = tmpp[i], x->keyvalue[i] = tmpk[i];
                x->pointer[x->sz] = tmpp[x->sz];
                p[cur - 1]->keyvalue[pp[cur - 1]] = tmpk[x->sz];
                for (i = 0; i < y->sz; ++i)y->pointer[i] = tmpp[i + x->sz + 1], y->keyvalue[i] = tmpk[i + x->sz + 1];
                y->pointer[y->sz] = tmpp[newsz];
                file->save(pos[cur]);
                file->save(pos[cur + 1]);
                file->save(pos[cur - 1]);
            }
        }